

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumValueDescriptor::CopyTo
          (EnumValueDescriptor *this,EnumValueDescriptorProto *proto)

{
  pointer pcVar1;
  size_type sVar2;
  FeatureSet *from;
  EnumValueOptions *this_00;
  EnumValueOptions *pEVar3;
  FeatureSet *this_01;
  Arena *arena;
  string_view value;
  
  pcVar1 = (this->all_names_->_M_dataplus)._M_p;
  sVar2 = this->all_names_->_M_string_length;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  arena = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  value._M_str = pcVar1;
  value._M_len = sVar2;
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,arena);
  (proto->field_0)._impl_.number_ = this->number_;
  *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
  pEVar3 = this->options_;
  if (pEVar3 != (EnumValueOptions *)_EnumValueOptions_default_instance_) {
    this_00 = EnumValueDescriptorProto::mutable_options(proto);
    EnumValueOptions::CopyFrom(this_00,pEVar3);
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    pEVar3 = EnumValueDescriptorProto::mutable_options(proto);
    this_01 = EnumValueOptions::mutable_features(pEVar3);
    FeatureSet::CopyFrom(this_01,from);
    return;
  }
  return;
}

Assistant:

void EnumValueDescriptor::CopyTo(EnumValueDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());

  if (&options() != &EnumValueOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}